

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_cost_inc.h
# Opt level: O1

double BrotliPopulationCostCommand(HistogramCommand *histogram)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  double dVar5;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint32_t __brotli_swap_tmp;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  undefined4 uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  uint32_t histo [4];
  size_t s [5];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined1 local_78 [16];
  double local_60;
  long local_58 [5];
  
  uVar15 = histogram->total_count_;
  dVar5 = 12.0;
  if (uVar15 == 0) {
    return 12.0;
  }
  iVar12 = 0;
  lVar11 = 0;
  do {
    if (histogram->data_[lVar11] != 0) {
      local_58[iVar12] = lVar11;
      iVar9 = iVar12 + 1;
      bVar4 = 3 < iVar12;
      iVar12 = iVar9;
      if (bVar4) break;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x2c0);
  uVar20 = (undefined4)(uVar15 >> 0x20);
  switch(iVar12) {
  case 1:
    break;
  case 2:
    auVar18._8_4_ = uVar20;
    auVar18._0_8_ = uVar15;
    auVar18._12_4_ = 0x45300000;
    dVar5 = (auVar18._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0) + 20.0;
    break;
  case 3:
    uVar10 = histogram->data_[local_58[0]];
    uVar2 = histogram->data_[local_58[1]];
    uVar3 = histogram->data_[local_58[2]];
    uVar7 = uVar3;
    if (uVar3 < uVar2) {
      uVar7 = uVar2;
    }
    if (uVar7 < uVar10) {
      uVar7 = uVar10;
    }
    dVar5 = (double)((uVar2 + uVar10 + uVar3) * 2) + 28.0;
    goto LAB_0010e5df;
  case 4:
    lVar11 = 0;
    do {
      *(uint32_t *)((long)&local_c8 + lVar11 * 4) = histogram->data_[local_58[lVar11]];
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    uVar15 = 0;
    uVar6 = uStack_c0;
    uVar13 = uVar15;
    do {
      for (; uVar15 < 3; uVar15 = uVar15 + 1) {
        uVar7 = *(uint *)((long)&local_c8 + uVar15 * 4 + 4);
        uVar10 = *(uint *)((long)&local_c8 + uVar13 * 4);
        uStack_c0 = uVar6;
        if (uVar10 < uVar7) {
          *(uint *)((long)&local_c8 + uVar15 * 4 + 4) = uVar10;
          *(uint *)((long)&local_c8 + uVar13 * 4) = uVar7;
        }
        uVar6 = uStack_c0;
      }
      uVar15 = uVar13 + 1;
      uVar13 = uVar15;
    } while (uVar15 != 4);
    uStack_c0._4_4_ = (int)((ulong)uVar6 >> 0x20);
    uStack_c0._0_4_ = (int)uVar6;
    uVar10 = uStack_c0._4_4_ + (int)uStack_c0;
    uVar7 = (uint)local_c8;
    if ((uint)local_c8 < uVar10) {
      uVar7 = uVar10;
    }
    local_c8._4_4_ = (int)((ulong)local_c8 >> 0x20);
    dVar5 = (double)(((uint)local_c8 + local_c8._4_4_) * 2) + (double)(uVar10 * 3) + 37.0;
LAB_0010e5df:
    dVar5 = dVar5 - (double)uVar7;
    break;
  default:
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_88 = 0;
    if (uVar15 < 0x100) {
      dVar23 = (double)kLog2Table[uVar15];
    }
    else {
      auVar22._8_4_ = uVar20;
      auVar22._0_8_ = uVar15;
      auVar22._12_4_ = 0x45300000;
      dVar23 = log2((auVar22._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0));
    }
    dVar5 = 0.0;
    uVar15 = 1;
    uVar13 = 0;
    iVar12 = local_88._4_4_;
    do {
      uVar8 = (ulong)histogram->data_[uVar13];
      if (uVar8 == 0) {
        uVar7 = 1;
        if (uVar13 < 0x2bf) {
          uVar7 = 0x2c0 - (int)uVar13;
          lVar11 = 0;
          do {
            if (histogram->data_[uVar13 + lVar11 + 1] != 0) {
              uVar7 = (int)lVar11 + 1;
              break;
            }
            lVar11 = lVar11 + 1;
          } while (0x2bf - uVar13 != lVar11);
        }
        uVar13 = uVar13 + uVar7;
        if (uVar13 != 0x2c0) {
          if (uVar7 < 3) {
            local_c8 = CONCAT44(local_c8._4_4_,(uint)local_c8 + uVar7);
          }
          else {
            uVar7 = uVar7 - 2;
            if (uVar7 != 0) {
              do {
                iVar12 = iVar12 + 1;
                dVar5 = dVar5 + 3.0;
                bVar4 = 7 < uVar7;
                uVar7 = uVar7 >> 3;
              } while (bVar4);
            }
          }
        }
        if (uVar13 == 0x2c0) break;
      }
      else {
        if (histogram->data_[uVar13] < 0x100) {
          dVar16 = (double)kLog2Table[uVar8];
        }
        else {
          dVar16 = log2((double)uVar8);
        }
        dVar21 = (dVar23 - dVar16) + 0.5;
        uVar8 = (ulong)dVar21;
        uVar8 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        dVar5 = dVar5 + (double)histogram->data_[uVar13] * (dVar23 - dVar16);
        if (0xe < uVar8) {
          uVar8 = 0xf;
        }
        if (uVar15 < uVar8) {
          uVar15 = uVar8;
        }
        piVar1 = (int *)((long)&local_c8 + (uVar8 & 0xffffffff) * 4);
        *piVar1 = *piVar1 + 1;
        uVar13 = uVar13 + 1;
      }
    } while (uVar13 < 0x2c0);
    local_60 = (double)(long)(uVar15 * 2 + 0x12);
    local_88 = CONCAT44(iVar12,(undefined4)local_88);
    dVar23 = 0.0;
    uVar13 = 0xfffffffffffffff8;
    uVar15 = 0;
    do {
      uVar8 = (ulong)*(uint *)((long)&uStack_c0 + uVar13);
      if (uVar8 < 0x100) {
        dVar16 = (double)kLog2Table[uVar8];
      }
      else {
        dVar16 = log2((double)uVar8);
      }
      uVar14 = (ulong)*(uint *)((long)&uStack_c0 + uVar13 + 4);
      dVar21 = (double)uVar14;
      if (uVar14 < 0x100) {
        dVar17 = (double)kLog2Table[uVar14];
      }
      else {
        local_78._0_8_ = dVar21;
        dVar17 = log2(dVar21);
        dVar21 = (double)local_78._0_8_;
      }
      uVar15 = uVar15 + uVar8 + uVar14;
      dVar23 = (dVar23 - (double)uVar8 * dVar16) - dVar21 * dVar17;
      uVar13 = uVar13 + 8;
    } while (uVar13 < 0x40);
    dVar5 = dVar5 + local_60;
    uVar20 = (undefined4)(uVar15 >> 0x20);
    if (uVar15 != 0) {
      auVar19._8_4_ = uVar20;
      auVar19._0_8_ = uVar15;
      auVar19._12_4_ = 0x45300000;
      dVar16 = auVar19._8_8_ - 1.9342813113834067e+25;
      local_78._0_8_ = dVar16 + ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
      if (uVar15 < 0x100) {
        dVar16 = (double)kLog2Table[uVar15];
      }
      else {
        local_78._8_4_ = SUB84(dVar16,0);
        local_78._12_4_ = (int)((ulong)dVar16 >> 0x20);
        dVar16 = log2((double)local_78._0_8_);
      }
      dVar23 = dVar23 + (double)local_78._0_8_ * dVar16;
    }
    auVar24._8_4_ = uVar20;
    auVar24._0_8_ = uVar15;
    auVar24._12_4_ = 0x45300000;
    dVar16 = (auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
    if (dVar16 <= dVar23) {
      dVar16 = dVar23;
    }
    dVar5 = dVar5 + dVar16;
  }
  return dVar5;
}

Assistant:

double FN(BrotliPopulationCost)(const HistogramType* histogram) {
  static const double kOneSymbolHistogramCost = 12;
  static const double kTwoSymbolHistogramCost = 20;
  static const double kThreeSymbolHistogramCost = 28;
  static const double kFourSymbolHistogramCost = 37;
  const size_t data_size = FN(HistogramDataSize)();
  int count = 0;
  size_t s[5];
  double bits = 0.0;
  size_t i;
  if (histogram->total_count_ == 0) {
    return kOneSymbolHistogramCost;
  }
  for (i = 0; i < data_size; ++i) {
    if (histogram->data_[i] > 0) {
      s[count] = i;
      ++count;
      if (count > 4) break;
    }
  }
  if (count == 1) {
    return kOneSymbolHistogramCost;
  }
  if (count == 2) {
    return (kTwoSymbolHistogramCost + (double)histogram->total_count_);
  }
  if (count == 3) {
    const uint32_t histo0 = histogram->data_[s[0]];
    const uint32_t histo1 = histogram->data_[s[1]];
    const uint32_t histo2 = histogram->data_[s[2]];
    const uint32_t histomax =
        BROTLI_MAX(uint32_t, histo0, BROTLI_MAX(uint32_t, histo1, histo2));
    return (kThreeSymbolHistogramCost +
            2 * (histo0 + histo1 + histo2) - histomax);
  }
  if (count == 4) {
    uint32_t histo[4];
    uint32_t h23;
    uint32_t histomax;
    for (i = 0; i < 4; ++i) {
      histo[i] = histogram->data_[s[i]];
    }
    /* Sort */
    for (i = 0; i < 4; ++i) {
      size_t j;
      for (j = i + 1; j < 4; ++j) {
        if (histo[j] > histo[i]) {
          BROTLI_SWAP(uint32_t, histo, j, i);
        }
      }
    }
    h23 = histo[2] + histo[3];
    histomax = BROTLI_MAX(uint32_t, h23, histo[0]);
    return (kFourSymbolHistogramCost +
            3 * h23 + 2 * (histo[0] + histo[1]) - histomax);
  }

  {
    /* In this loop we compute the entropy of the histogram and simultaneously
       build a simplified histogram of the code length codes where we use the
       zero repeat code 17, but we don't use the non-zero repeat code 16. */
    size_t max_depth = 1;
    uint32_t depth_histo[BROTLI_CODE_LENGTH_CODES] = { 0 };
    const double log2total = FastLog2(histogram->total_count_);
    for (i = 0; i < data_size;) {
      if (histogram->data_[i] > 0) {
        /* Compute -log2(P(symbol)) = -log2(count(symbol)/total_count) =
                                    = log2(total_count) - log2(count(symbol)) */
        double log2p = log2total - FastLog2(histogram->data_[i]);
        /* Approximate the bit depth by round(-log2(P(symbol))) */
        size_t depth = (size_t)(log2p + 0.5);
        bits += histogram->data_[i] * log2p;
        if (depth > 15) {
          depth = 15;
        }
        if (depth > max_depth) {
          max_depth = depth;
        }
        ++depth_histo[depth];
        ++i;
      } else {
        /* Compute the run length of zeros and add the appropriate number of 0
           and 17 code length codes to the code length code histogram. */
        uint32_t reps = 1;
        size_t k;
        for (k = i + 1; k < data_size && histogram->data_[k] == 0; ++k) {
          ++reps;
        }
        i += reps;
        if (i == data_size) {
          /* Don't add any cost for the last zero run, since these are encoded
             only implicitly. */
          break;
        }
        if (reps < 3) {
          depth_histo[0] += reps;
        } else {
          reps -= 2;
          while (reps > 0) {
            ++depth_histo[BROTLI_REPEAT_ZERO_CODE_LENGTH];
            /* Add the 3 extra bits for the 17 code length code. */
            bits += 3;
            reps >>= 3;
          }
        }
      }
    }
    /* Add the estimated encoding cost of the code length code histogram. */
    bits += (double)(18 + 2 * max_depth);
    /* Add the entropy of the code length code histogram. */
    bits += BitsEntropy(depth_histo, BROTLI_CODE_LENGTH_CODES);
  }
  return bits;
}